

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorRefactor.cpp
# Opt level: O2

HighsInt __thiscall HFactor::rebuild(HFactor *this,HighsTimerClock *factor_timer_clock_pointer)

{
  byte bVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  HighsInt iK;
  ulong uVar7;
  HighsInt section;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  vector<int,_std::allocator<int>_> *this_00;
  HighsInt iEl;
  vector<double,_std::allocator<double>_> *this_01;
  HighsInt k;
  int iVar12;
  HighsInt HVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> *this_02;
  reference rVar15;
  HighsInt iRow_2;
  HighsInt local_iRow;
  undefined4 uStack_1b4;
  double local_1b0;
  long local_1a8;
  int local_1a0;
  HighsInt local_iRow_2;
  long local_198;
  vector<int,_std::allocator<int>_> *local_190;
  double local_188;
  vector<double,_std::allocator<double>_> *local_180;
  vector<int,_std::allocator<int>_> *local_178;
  vector<int,_std::allocator<int>_> *local_170;
  vector<double,_std::allocator<double>_> *local_168;
  long local_160;
  ulong local_158;
  int local_14c;
  vector<int,_std::allocator<int>_> *local_148;
  vector<double,_std::allocator<double>_> *local_140;
  vector<int,_std::allocator<int>_> *local_138;
  HighsInt iRow;
  vector<bool,_std::allocator<bool>_> has_pivot;
  HVector column;
  
  luClear(this);
  this->nwork = 0;
  this->basis_matrix_num_el = 0;
  local_14c = this->num_row;
  has_pivot.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  has_pivot.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  has_pivot.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  has_pivot.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  has_pivot.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&has_pivot,(long)local_14c,false);
  this->build_synthetic_tick = (this->refactor_info_).build_synthetic_tick;
  local_178 = &this->u_index;
  local_180 = &this->u_value;
  local_190 = &this->l_start;
  local_138 = &this->l_index;
  this_00 = &this->u_pivot_index;
  this_01 = &this->u_pivot_value;
  this_02 = &this->u_start;
  local_140 = &this->l_value;
  lVar11 = 0;
  local_170 = this_02;
  local_168 = this_01;
  local_148 = this_00;
  while( true ) {
    iVar8 = this->num_row;
    iVar12 = local_14c;
    if (iVar8 <= lVar11) break;
    iRow = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11];
    iVar12 = (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
    local_1b0 = (double)CONCAT44(local_1b0._4_4_,iVar12);
    bVar1 = (this->refactor_info_).pivot_type.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11];
    local_160 = lVar11;
    if (bVar1 < 2) {
      this->basis_matrix_num_el = this->basis_matrix_num_el + 1;
      column.size = (HighsInt)
                    ((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_190,&column.size);
      std::vector<int,_std::allocator<int>_>::push_back(this_00,&iRow);
      column.size = 0;
      column.count = 0x3ff00000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,(double *)&column);
      column.size = (HighsInt)
                    ((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,&column.size);
    }
    else {
      if ((bVar1 & 0xfe) != 2) {
        iVar12 = (int)lVar11;
        break;
      }
      iVar8 = this->a_start[iVar12];
      local_198 = (long)this->a_start[(long)iVar12 + 1];
      lVar9 = (long)iVar8;
      for (lVar11 = lVar9; lVar11 < local_198; lVar11 = lVar11 + 1) {
        if (this->a_index[lVar11] == iRow) goto LAB_0035c160;
      }
      lVar11 = 0xffffffff;
LAB_0035c160:
      iVar12 = (int)lVar11;
      local_1a8 = (long)iVar12;
      if (ABS(this->a_value[local_1a8]) < this->pivot_tolerance) {
        HVar13 = this->nwork + 1;
        goto LAB_0035c935;
      }
      if (bVar1 == 2) {
        local_188 = 1.0 / this->a_value[local_1a8];
        local_158 = CONCAT44(local_158._4_4_,iVar12 + 1);
        iVar5 = 0;
        while (iVar5 != 2) {
          iVar6 = (int)local_158;
          if (iVar5 == 0) {
            iVar6 = iVar8;
          }
          iVar4 = (int)local_198;
          if (iVar5 == 0) {
            iVar4 = iVar12;
          }
          lVar9 = (long)iVar6;
          lVar11 = lVar9 * 8;
          local_1a0 = iVar5;
          for (; lVar9 < iVar4; lVar9 = lVar9 + 1) {
            _local_iRow = (double)CONCAT44(uStack_1b4,this->a_index[lVar9]);
            rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&has_pivot,(long)this->a_index[lVar9]);
            if ((*rVar15._M_p & rVar15._M_mask) == 0) {
              std::vector<int,_std::allocator<int>_>::push_back(local_138,&local_iRow);
              column._0_8_ = this->a_value[lVar9] * local_188;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        (local_140,(double *)&column);
            }
            else {
              std::vector<int,_std::allocator<int>_>::push_back(local_178,&local_iRow);
              std::vector<double,_std::allocator<double>_>::push_back
                        (local_180,(value_type_conflict1 *)((long)this->a_value + lVar11));
            }
            lVar11 = lVar11 + 8;
          }
          iVar5 = local_1a0 + 1;
        }
        column.size = (HighsInt)
                      ((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_190,&column.size);
        this_00 = local_148;
        std::vector<int,_std::allocator<int>_>::push_back(local_148,&iRow);
        this_01 = local_168;
        this_02 = local_170;
        std::vector<double,_std::allocator<double>_>::push_back(local_168,this->a_value + local_1a8)
        ;
        column.size = (HighsInt)
                      ((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,&column.size);
      }
      else {
        lVar11 = lVar9 * 4;
        lVar14 = lVar9 * 8;
        for (; lVar9 < local_1a8; lVar9 = lVar9 + 1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (local_178,(value_type_conflict2 *)((long)this->a_index + lVar11));
          std::vector<double,_std::allocator<double>_>::push_back
                    (local_180,(value_type_conflict1 *)((long)this->a_value + lVar14));
          lVar11 = lVar11 + 4;
          lVar14 = lVar14 + 8;
        }
        lVar11 = local_1a8 * 4;
        lVar9 = local_1a8 * 8;
        lVar14 = local_1a8;
        while( true ) {
          lVar9 = lVar9 + 8;
          lVar11 = lVar11 + 4;
          lVar14 = lVar14 + 1;
          if (local_198 <= lVar14) break;
          std::vector<int,_std::allocator<int>_>::push_back
                    (local_178,(value_type_conflict2 *)((long)this->a_index + lVar11));
          std::vector<double,_std::allocator<double>_>::push_back
                    (local_180,(value_type_conflict1 *)(lVar9 + (long)this->a_value));
        }
        column.size = (HighsInt)
                      ((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_190,&column.size);
        std::vector<int,_std::allocator<int>_>::push_back(this_00,&iRow);
        this_01 = local_168;
        this_02 = local_170;
        std::vector<double,_std::allocator<double>_>::push_back(local_168,this->a_value + local_1a8)
        ;
        column.size = (HighsInt)
                      ((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,&column.size);
      }
    }
    this->basic_index[iRow] = local_1b0._0_4_;
    rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](&has_pivot,(long)iRow);
    *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
    lVar11 = local_160 + 1;
  }
  if (iVar12 < iVar8) {
    std::vector<int,_std::allocator<int>_>::resize(local_190,(long)iVar8 + 1);
    piVar2 = (local_190->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)iVar12;
    for (lVar9 = lVar11; lVar9 < this->num_row; lVar9 = lVar9 + 1) {
      piVar2[lVar9 + 1] = piVar2[lVar9];
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_index,(long)this->num_row);
    piVar2 = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 < this->num_row; lVar9 = lVar9 + 1) {
      piVar3[lVar9] = piVar2[lVar9];
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_lookup,(long)this->num_row);
    piVar2 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 < this->num_row; lVar9 = lVar9 + 1) {
      piVar3[piVar2[lVar9]] = (int)lVar9;
    }
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&iRow,&has_pivot);
    column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HVectorBase<double>::setup(&column,this->num_row);
    local_1b0 = 0.0;
    while( true ) {
      HVar13 = (HighsInt)this_02;
      lVar9 = (long)this->num_row;
      if (lVar9 <= lVar11) break;
      iRow_2 = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11];
      iVar8 = (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_start[lVar11];
      local_1a8 = lVar9;
      HVectorBase<double>::clear(&column);
      local_198 = CONCAT44(local_198._4_4_,iVar8);
      this_02 = (vector<int,_std::allocator<int>_> *)(long)this->a_start[(long)iVar8 + 1];
      for (lVar9 = (long)this->a_start[iVar8]; lVar9 < (long)this_02; lVar9 = lVar9 + 1) {
        _local_iRow = (double)CONCAT44(uStack_1b4,this->a_index[lVar9]);
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&iRow,(long)this->a_index[lVar9])
        ;
        if ((*rVar15._M_p & rVar15._M_mask) == 0) {
          lVar14 = (long)column.count;
          column.count = column.count + 1;
          column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[lVar14] = local_iRow;
          column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_iRow] = this->a_value[lVar9];
        }
        else {
          std::vector<int,_std::allocator<int>_>::push_back(local_178,&local_iRow);
          std::vector<double,_std::allocator<double>_>::push_back(local_180,this->a_value + lVar9);
        }
      }
      ftranL(this,&column,local_1b0,(HighsTimerClock *)0x0);
      local_1b0 = local_1b0 * 0.95;
      local_188 = ((double)column.count / (double)this->num_row) * 0.05;
      HVectorBase<double>::tight(&column);
      local_1b0 = local_1b0 + local_188;
      local_1a0 = column.count;
      uVar7 = 0;
      if (0 < column.count) {
        uVar7 = (ulong)(uint)column.count;
      }
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if (column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] == iRow_2) goto LAB_0035c734;
      }
      uVar10 = 0xffffffff;
LAB_0035c734:
      if (ABS(column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iRow_2]) < this->pivot_tolerance) {
        HVar13 = this->num_row - (int)lVar11;
        lVar9 = local_1a8;
        break;
      }
      local_188 = 1.0 / column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iRow_2];
      local_1a8 = CONCAT44(local_1a8._4_4_,(int)uVar10 + 1);
      HVar13 = (HighsInt)local_198;
      local_160 = lVar11;
      local_158 = uVar10;
      for (iVar8 = 0; lVar11 = local_160, iVar8 != 2; iVar8 = iVar8 + 1) {
        iVar5 = local_1a0;
        iVar12 = (int)local_1a8;
        if (iVar8 == 0) {
          iVar5 = (int)local_158;
          iVar12 = 0;
        }
        this_02 = (vector<int,_std::allocator<int>_> *)(long)iVar5;
        for (lVar11 = (long)iVar12; lVar11 < (long)this_02; lVar11 = lVar11 + 1) {
          local_iRow_2 = column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&has_pivot,(long)local_iRow_2);
          if ((*rVar15._M_p & rVar15._M_mask) == 0) {
            std::vector<int,_std::allocator<int>_>::push_back(local_138,&local_iRow_2);
            _local_iRow = column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[local_iRow_2] * local_188;
            std::vector<double,_std::allocator<double>_>::emplace_back<double>
                      (local_140,(double *)&local_iRow);
          }
          else {
            std::vector<int,_std::allocator<int>_>::push_back(local_178,&local_iRow_2);
            std::vector<double,_std::allocator<double>_>::push_back
                      (local_180,
                       column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + local_iRow_2);
          }
        }
        HVar13 = (HighsInt)local_198;
      }
      (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_160 + 1] =
           (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      std::vector<int,_std::allocator<int>_>::push_back(local_148,&iRow_2);
      std::vector<double,_std::allocator<double>_>::push_back
                (local_168,
                 column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iRow_2);
      _local_iRow = (double)CONCAT44(uStack_1b4,
                                     (int)((ulong)((long)(this->u_index).
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->u_index).
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_170,&local_iRow);
      this->basic_index[iRow_2] = HVar13;
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](&has_pivot,(long)iRow_2);
      *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
      lVar11 = lVar11 + 1;
    }
    HVectorBase<double>::~HVectorBase(&column);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&iRow);
    if (lVar11 < lVar9) goto LAB_0035c935;
  }
  HVar13 = 0;
  buildFinish(this);
LAB_0035c935:
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&has_pivot.super__Bvector_base<std::allocator<bool>_>);
  return HVar13;
}

Assistant:

HighsInt HFactor::rebuild(HighsTimerClock* factor_timer_clock_pointer) {
  const bool report_lu = false;
  // Check that the refactorization information should be used
  assert(refactor_info_.use);
  /**
   * 0. Clear L and U factor
   */
  luClear();

  nwork = 0;
  basis_matrix_num_el = 0;
  HighsInt stage = num_row;
  HighsInt rank_deficiency = 0;
  vector<bool> has_pivot;
  has_pivot.assign(num_row, false);
  const bool report_unit = false;
  const bool report_singletons = false;
  const bool report_markowitz = false;
  const bool report_anything =
      report_unit || report_singletons || report_markowitz;
  if (report_anything) printf("\nRefactor\n");
  // Take build_synthetic_tick from the refactor info so that this
  // refactorization doesn't look unrealistically cheap.
  this->build_synthetic_tick = this->refactor_info_.build_synthetic_tick;
  // Check that the refactorization info has been set up
  assert((int)this->refactor_info_.pivot_row.size() >= num_row);
  assert((int)this->refactor_info_.pivot_var.size() >= num_row);
  assert((int)this->refactor_info_.pivot_type.size() >= num_row);
  for (HighsInt iK = 0; iK < num_row; iK++) {
    HighsInt iRow = this->refactor_info_.pivot_row[iK];
    HighsInt iVar = this->refactor_info_.pivot_var[iK];
    int8_t pivot_type = this->refactor_info_.pivot_type[iK];
    assert(!has_pivot[iRow]);

    if (pivot_type == kPivotLogical || pivot_type == kPivotUnit) {
      if (pivot_type == kPivotLogical) {
        //
        // 1.1 Logical column
        if (report_unit) printf("Stage %d: Logical\n", (int)iK);
        assert(iVar >= num_col);
        basis_matrix_num_el++;
      } else if (pivot_type == kPivotUnit) {
        //
        // 1.2 (Structural) unit column
        if (report_unit) printf("Stage %d: Unit\n", (int)iK);
        assert(iVar < num_col);
        HighsInt start = a_start[iVar];
        HighsInt count = a_start[iVar + 1] - start;
        assert(a_index[start] == iRow);
        assert(count == 1 && a_value[start] == 1);
        basis_matrix_num_el++;
      }
      // 1.3 Record unit column
      l_start.push_back(l_index.size());
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(1);
      u_start.push_back(u_index.size());
    } else if (pivot_type == kPivotRowSingleton ||
               pivot_type == kPivotColSingleton) {
      //
      // Row or column singleton
      assert(iVar < num_col);
      const HighsInt start = a_start[iVar];
      const HighsInt end = a_start[iVar + 1];
      // Find where the pivot is
      HighsInt pivot_k = -1;
      for (HighsInt k = start; k < end; k++) {
        if (a_index[k] == iRow) {
          pivot_k = k;
          break;
        }
      }
      assert(pivot_k >= 0);
      // Check that the pivot isn't too small. Shouldn't happen since
      // this is refactorization
      double abs_pivot = std::fabs(a_value[pivot_k]);
      assert(abs_pivot >= pivot_tolerance);
      if (abs_pivot < pivot_tolerance) {
        rank_deficiency = nwork + 1;
        return rank_deficiency;
      }
      if (pivot_type == kPivotRowSingleton) {
        //
        // 2.2 Deal with row singleton
        const double pivot_multiplier = 1 / a_value[pivot_k];
        if (report_singletons)
          printf("Stage %d: Row singleton (%4d, %g)\n", (int)iK, (int)pivot_k,
                 pivot_multiplier);
        for (HighsInt section = 0; section < 2; section++) {
          HighsInt p0 = section == 0 ? start : pivot_k + 1;
          HighsInt p1 = section == 0 ? pivot_k : end;
          for (HighsInt k = p0; k < p1; k++) {
            HighsInt local_iRow = a_index[k];
            if (!has_pivot[local_iRow]) {
              if (report_singletons)
                printf("Row singleton: L En (%4d, %11.4g)\n", (int)local_iRow,
                       a_value[k] * pivot_multiplier);
              l_index.push_back(local_iRow);
              l_value.push_back(a_value[k] * pivot_multiplier);
            } else {
              if (report_singletons)
                printf("Row singleton: U En (%4d, %11.4g)\n", (int)local_iRow,
                       a_value[k]);
              u_index.push_back(local_iRow);
              u_value.push_back(a_value[k]);
            }
          }
        }
        l_start.push_back(l_index.size());
        if (report_singletons)
          printf("Row singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 a_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(a_value[pivot_k]);
        u_start.push_back(u_index.size());
      } else {
        //
        // 2.3 Deal with column singleton
        if (report_singletons) printf("Stage %d: Col singleton\n", (int)iK);
        for (HighsInt k = start; k < pivot_k; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)a_index[k],
                   a_value[k]);
          u_index.push_back(a_index[k]);
          u_value.push_back(a_value[k]);
        }
        for (HighsInt k = pivot_k + 1; k < end; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)a_index[k],
                   a_value[k]);
          u_index.push_back(a_index[k]);
          u_value.push_back(a_value[k]);
        }
        l_start.push_back(l_index.size());
        if (report_singletons)
          printf("Col singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 a_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(a_value[pivot_k]);
        u_start.push_back(u_index.size());
      }
    } else {
      assert(pivot_type == kPivotMarkowitz);
      stage = iK;
      break;
    }
    basic_index[iRow] = iVar;
    has_pivot[iRow] = true;
  }
  if (report_lu) {
    printf("\nAfter units and singletons\n");
    reportLu(kReportLuBoth, false);
  }
  if (stage < num_row) {
    // Handle the remaining Markowitz pivots
    //
    // First of all complete the L factor with identity columns so
    // that FtranL counts the RHS entries in rows that don't yet have
    // picots by running to completion. In the hyper-sparse code,
    // these will HOPEFULLY be skipped
    //
    // There are already l_start entries for the first stage rows, but
    // l_pivot_index is not assigned, as u_pivot_index gets copied into it
    l_start.resize(num_row + 1);
    for (HighsInt iK = stage; iK < num_row; iK++) l_start[iK + 1] = l_start[iK];
    l_pivot_index.resize(num_row);
    for (HighsInt iK = 0; iK < num_row; iK++)
      l_pivot_index[iK] = this->refactor_info_.pivot_row[iK];
    // To do hyper-sparse FtranL operations, have to set up l_pivot_lookup.
    l_pivot_lookup.resize(num_row);
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow < stage) {
        if (l_pivot_lookup[l_pivot_index[iRow]] != iRow) {
          // printf("Strange: Thought that l_pivot_lookup[l_pivot_index[iRow]]
          // == iRow\n");
        }
      }
      l_pivot_lookup[l_pivot_index[iRow]] = iRow;
    }
    // Need to know whether to consider matrix entries for FtranL
    // operation. Initially these correspond to all the rows without
    // pivots
    vector<bool> not_in_bump = has_pivot;
    // Monitor density of FtranL result to possibly switch from exploiting
    // hyper-sparsity
    double expected_density = 0.0;
    // Initialise a HVector in which the L and U entries of the
    // pivotal column will be formed
    HVector column;
    column.setup(num_row);
    for (HighsInt iK = stage; iK < num_row; iK++) {
      HighsInt iRow = this->refactor_info_.pivot_row[iK];
      HighsInt iVar = this->refactor_info_.pivot_var[iK];
      int8_t pivot_type = this->refactor_info_.pivot_type[iK];
      assert(!has_pivot[iRow]);
      assert(pivot_type == kPivotMarkowitz);
      // Set up the column for the FtranL. It contains the matrix
      // entries in rows without pivots, and the remaining entries
      // start forming the U column
      column.clear();
      HighsInt start = a_start[iVar];
      HighsInt end = a_start[iVar + 1];
      for (HighsInt iEl = start; iEl < end; iEl++) {
        HighsInt local_iRow = a_index[iEl];
        if (not_in_bump[local_iRow]) {
          u_index.push_back(local_iRow);
          u_value.push_back(a_value[iEl]);
        } else {
          column.index[column.count++] = local_iRow;
          column.array[local_iRow] = a_value[iEl];
        }
      }
      // Perform FtranL, but don't time it!
      ftranL(column, expected_density);
      // Update the running average density
      double local_density = (1.0 * column.count) / num_row;
      expected_density = kRunningAverageMultiplier * local_density +
                         (1 - kRunningAverageMultiplier) * expected_density;
      // Strip out small values
      column.tight();
      // Now form the column of L
      //
      // Find the pivot
      HighsInt pivot_k = -1;
      start = 0;
      end = column.count;
      for (HighsInt k = start; k < end; k++) {
        if (column.index[k] == iRow) {
          pivot_k = k;
          break;
        }
      }
      assert(pivot_k >= 0);
      // Check that the pivot isn't too small. Shouldn't happen since
      // this is refactorization
      double abs_pivot = std::fabs(column.array[iRow]);
      assert(abs_pivot >= pivot_tolerance);
      if (abs_pivot < pivot_tolerance) {
        rank_deficiency = num_row - iK;
        return rank_deficiency;
      }
      const double pivot_multiplier = 1 / column.array[iRow];
      for (HighsInt section = 0; section < 2; section++) {
        HighsInt p0 = section == 0 ? start : pivot_k + 1;
        HighsInt p1 = section == 0 ? pivot_k : end;
        for (HighsInt k = p0; k < p1; k++) {
          HighsInt local_iRow = column.index[k];
          if (!has_pivot[local_iRow]) {
            l_index.push_back(local_iRow);
            l_value.push_back(column.array[local_iRow] * pivot_multiplier);
          } else {
            u_index.push_back(local_iRow);
            u_value.push_back(column.array[local_iRow]);
          }
        }
      }
      l_start[iK + 1] = l_index.size();
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(column.array[iRow]);
      u_start.push_back(u_index.size());
      basic_index[iRow] = iVar;
      has_pivot[iRow] = true;
      if (report_lu) {
        printf("\nAfter Markowitz %d\n", (int)(iK - stage));
        reportLu(kReportLuBoth, false);
      }
    }
  }
  if (report_lu) {
    printf("\nRefactored INVERT\n");
    reportLu(kReportLuBoth, false);
  }
  buildFinish();
  return 0;
}